

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

bool __thiscall Imf_3_4::IDManifest::merge(IDManifest *this,IDManifest *other)

{
  bool bVar1;
  pointer pCVar2;
  Iterator IVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  bVar8 = false;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(other->_manifest).
                             super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(other->_manifest).
                            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xd0); uVar7 = uVar7 + 1) {
    bVar5 = false;
    for (uVar6 = 0;
        pCVar2 = (this->_manifest).
                 super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)(((long)(this->_manifest).
                               super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0xd0);
        uVar6 = uVar6 + 1) {
      bVar1 = std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(pCVar2 + uVar6),
                              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((other->_manifest).
                                  super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar7));
      if (bVar1) {
        bVar1 = std::operator!=(&(other->_manifest).
                                 super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._components,
                                &(this->_manifest).
                                 super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar6]._components);
        bVar5 = true;
        if (bVar1) {
          bVar8 = true;
        }
        else {
          pCVar2 = (other->_manifest).
                   super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          p_Var4 = *(_Base_ptr *)((long)&pCVar2[uVar7]._table._M_t + 0x18);
          while (p_Var4 != (_Rb_tree_node_base *)((long)&pCVar2[uVar7]._table._M_t + 8U)) {
            IVar3 = ChannelGroupManifest::find
                              ((this->_manifest).
                               super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar6,
                               *(uint64_t *)(p_Var4 + 1));
            pCVar2 = (this->_manifest).
                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (IVar3._i._M_node == ((_Base_ptr)((long)&pCVar2[uVar6]._table._M_t + 8U))._M_node) {
              ChannelGroupManifest::insert
                        (pCVar2 + uVar6,*(uint64_t *)(p_Var4 + 1),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var4[1]._M_parent);
            }
            else {
              bVar1 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)((long)IVar3._i._M_node + 0x28),
                                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&p_Var4[1]._M_parent);
              bVar8 = (bool)(bVar8 | bVar1);
            }
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
            pCVar2 = (other->_manifest).
                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
      }
    }
    if (!bVar5) {
      std::
      vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ::push_back(&this->_manifest,
                  (other->_manifest).
                  super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar7);
    }
  }
  return bVar8;
}

Assistant:

bool
IDManifest::merge (const IDManifest& other)
{
    bool conflict = false;
    for (size_t otherManifest = 0; otherManifest < other._manifest.size ();
         ++otherManifest)
    {
        bool merged = false;
        for (size_t thisManifest = 0; thisManifest < _manifest.size ();
             ++thisManifest)
        {
            if (_manifest[thisManifest]._channels ==
                other._manifest[otherManifest]._channels)
            {
                // found same channels

                merged = true;

                if (other._manifest[otherManifest]._components !=
                    _manifest[thisManifest]._components)
                {
                    // cannot merge if components are different
                    conflict = true;
                }
                else
                {

                    //                    if(other._manifest[otherManifest]._encodingScheme !=  _manifest[thisManifest]._encodingScheme ||
                    //                        other._manifest[otherManifest]._hashScheme !=  _manifest[thisManifest]._hashScheme ||
                    //                        other._manifest[otherManifest]._hashScheme !=  _manifest[thisManifest]._hashScheme ||
                    //                        other._manifest[otherManifest]._lifeTime !=  _manifest[thisManifest]._lifeTime)
                    //                    {
                    //                        conflict = true;
                    //                    }

                    for (IDManifest::ChannelGroupManifest::ConstIterator it =
                             other._manifest[otherManifest].begin ();
                         it != other._manifest[otherManifest].end ();
                         ++it)
                    {
                        IDManifest::ChannelGroupManifest::ConstIterator ours =
                            _manifest[thisManifest].find (it.id ());
                        if (ours == _manifest[thisManifest].end ())
                        {
                            _manifest[thisManifest].insert (
                                it.id (), it.text ());
                        }
                        else
                        {
                            if (ours.text () != it.text ()) { conflict = true; }
                        }
                    }
                }
            }
        }

        if (!merged) { _manifest.push_back (other._manifest[otherManifest]); }
    }

    return conflict;
}